

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O3

RotationZ<std::complex<float>_> *
qclab::qgates::operator*
          (RotationZ<std::complex<float>_> *__return_storage_ptr__,
          RotationZ<std::complex<float>_> *lhs,RotationZ<std::complex<float>_> *rhs)

{
  float fVar1;
  float fVar2;
  angle_type aVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar5 = (lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
          qubit_;
  iVar4 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar5 != iVar4) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZ.hpp"
                  ,0xb2,"RotationZ<T> qclab::qgates::operator*(RotationZ<T>, const RotationZ<T> &)")
    ;
  }
  iVar5 = (*(lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(lhs);
  iVar4 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar5 == iVar4) {
    aVar3 = (lhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_;
    fVar6 = aVar3.cos_;
    fVar7 = aVar3.sin_;
    fVar1 = (rhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_;
    fVar2 = (rhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_;
    aVar3.sin_ = fVar1 * fVar7 + fVar6 * fVar2;
    aVar3.cos_ = fVar1 * fVar6 + -fVar7 * fVar2;
    (lhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_ = aVar3;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).
    super_QGate1<std::complex<float>_>.qubit_ =
         (lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_
    ;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).
    super_QGate1<std::complex<float>_>.field_0xc =
         (lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
         field_0xc;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).rotation_.angle_ =
         (lhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).
    super_QGate1<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004eb9a0;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZ.hpp"
                ,0xa3,
                "RotationZ<T> &qclab::qgates::RotationZ<std::complex<float>>::operator*=(const RotationZ<T> &) [T = std::complex<float>]"
               );
}

Assistant:

RotationZ< T > operator*( RotationZ< T > lhs ,
                                         const RotationZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }